

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

bool __thiscall cmUuid::IntFromHexDigit(cmUuid *this,char input,char *output)

{
  char *output_local;
  char input_local;
  cmUuid *this_local;
  
  if ((input < '0') || ('9' < input)) {
    if ((input < 'a') || ('f' < input)) {
      if ((input < 'A') || ('F' < input)) {
        this_local._7_1_ = false;
      }
      else {
        *output = input + -0x37;
        this_local._7_1_ = true;
      }
    }
    else {
      *output = input + -0x57;
      this_local._7_1_ = true;
    }
  }
  else {
    *output = input + -0x30;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmUuid::IntFromHexDigit(char input, char& output) const
{
  if (input >= '0' && input <= '9') {
    output = static_cast<char>(input - '0');
    return true;
  }
  if (input >= 'a' && input <= 'f') {
    output = static_cast<char>(input - 'a' + 0xA);
    return true;
  }
  if (input >= 'A' && input <= 'F') {
    output = static_cast<char>(input - 'A' + 0xA);
    return true;
  }
  return false;
}